

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O1

double testExtendedKalmanFilterZeroInput(void)

{
  double **ppdVar1;
  double **ppdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  Scalar SVar7;
  double *pdVar8;
  Index IVar9;
  LhsNested __ptr;
  RhsNested pMVar10;
  int iVar11;
  Index size;
  void *pvVar12;
  undefined8 *puVar13;
  void **ppvVar14;
  long lVar15;
  double *pdVar16;
  TimeIndex k;
  char *pcVar17;
  Index index;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *pPVar18;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *pPVar19;
  uint uVar20;
  ActualDstType actualDst_3;
  ulong uVar21;
  long lVar22;
  Index *pIVar23;
  ActualDstType actualDst;
  ActualDstType actualDst_2;
  DenseStorage<double,__1,__1,_1,_0> *this;
  Index dstRows;
  undefined4 uVar24;
  undefined4 uVar25;
  StateVector x;
  Cmatrix c;
  Pmatrix p;
  StateVector xh;
  StateVector v;
  StateVector error;
  Qmatrix q1;
  Rmatrix r;
  StateVector dx;
  Rmatrix r1;
  KalmanFunctor func;
  InputVector u;
  Qmatrix q;
  StateVector xk [1001];
  lagged_fibonacci1279 gen_;
  MeasureVector yk [1000];
  scalar_sum_op<double,_double> local_a6d1;
  InputVector local_a6d0;
  double local_a6c0;
  Matrix<double,__1,__1,_0,__1,__1> local_a6b8;
  Matrix<double,__1,__1,_0,__1,__1> local_a6a0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_a688;
  Matrix<double,__1,__1,_0,__1,__1> local_a678;
  undefined8 local_a660;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *local_a650;
  RhsNested pMStack_a648;
  Matrix<double,__1,__1,_0,__1,__1> local_a640;
  Matrix<double,__1,__1,_0,__1,__1> local_a628;
  void *local_a610 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_a600;
  StateVector local_a5e8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *pPStack_a5d8;
  void **local_a5d0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *pPStack_a5c8;
  void *local_a5c0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *pPStack_a5b8;
  void **local_a5b0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  *pPStack_a5a8;
  Matrix<double,__1,__1,_0,__1,__1> local_a5a0;
  Matrix<double,__1,__1,_0,__1,__1> MStack_a588;
  void *local_a570;
  void *local_a560;
  undefined8 auStack_a558 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_a548;
  undefined8 local_a530;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_66c8;
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_66b8;
  Matrix<double,__1,__1,_0,__1,__1> local_3eb8 [667];
  
  if ((testExtendedKalmanFilterZeroInput()::f == '\0') &&
     (iVar11 = __cxa_guard_acquire(&testExtendedKalmanFilterZeroInput()::f), iVar11 != 0)) {
    stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
              ((ExtendedKalmanFilter *)testExtendedKalmanFilterZeroInput()::f,4,3);
    __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                 testExtendedKalmanFilterZeroInput()::f,&__dso_handle);
    __cxa_guard_release(&testExtendedKalmanFilterZeroInput()::f);
  }
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            ((DynamicalSystemFunctorBase *)&local_a5e8);
  local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&PTR__KalmanFunctor_0011ecd8;
  local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pPStack_a5d8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)0x0;
  local_a5d0 = (void **)0x0;
  pPStack_a5c8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)0x0;
  local_a5c0 = (void *)0x0;
  pPStack_a5b8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)0x0;
  local_a5b0 = (void **)0x0;
  pPStack_a5a8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)0x0;
  local_a5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_a5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_a5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  MStack_a588.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  MStack_a588.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  MStack_a588.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  stateObservation::ObserverBase::measureVectorRandom();
  IVar9 = local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  pdVar8 = local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  if (local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <
      0) {
LAB_001071a0:
    pcVar17 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
    ;
LAB_001071b5:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar17);
  }
  if (pPStack_a5b8 !=
      (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
       *)local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows) {
    pvVar12 = local_a5c0;
    if (pPStack_a5b8 !=
        (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
         *)local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) {
      free(local_a5c0);
      if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
           *)IVar9 ==
          (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
           *)0x0) {
        pvVar12 = (void *)0x0;
      }
      else {
        if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
             *)0x1fffffffffffffff < (ulong)IVar9) {
LAB_001062ff:
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = operator_delete;
          __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pvVar12 = malloc(IVar9 * 8);
        if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
             *)IVar9 !=
            (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
             *)0x1 && ((ulong)pvVar12 & 0xf) != 0) goto LAB_0010716a;
        if (pvVar12 == (void *)0x0) goto LAB_001062ff;
      }
    }
    local_a5c0 = pvVar12;
    pPStack_a5b8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)IVar9;
  }
  if (pPStack_a5b8 ==
      (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
       *)IVar9) {
    pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)((long)pPStack_a5b8 - ((long)pPStack_a5b8 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pPStack_a5b8) {
      lVar22 = 0;
      do {
        pdVar3 = pdVar8 + lVar22;
        dVar6 = pdVar3[1];
        pdVar16 = (double *)((long)local_a5c0 + lVar22 * 8);
        *pdVar16 = *pdVar3 * 0.1;
        pdVar16[1] = dVar6 * 0.1;
        lVar22 = lVar22 + 2;
      } while (lVar22 < (long)pPVar18);
    }
    if ((long)pPVar18 < (long)pPStack_a5b8) {
      do {
        *(double *)((long)local_a5c0 + (long)pPVar18 * 8) = pdVar8[(long)pPVar18] * 0.1;
        pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              &pPVar18->m_lhs)->m_storage).m_data + 1);
      } while (pPStack_a5b8 != pPVar18);
    }
    free(local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    stateObservation::ObserverBase::stateVectorRandom();
    IVar9 = local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    pdVar8 = local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    if (local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        < 0) goto LAB_001071a0;
    if (pPStack_a5d8 !=
        (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
         *)local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) {
      pvVar12 = (void *)local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows;
      if (pPStack_a5d8 !=
          (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
           *)local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows) {
        free((void *)local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
        if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
             *)IVar9 ==
            (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
             *)0x0) {
          pvVar12 = (void *)0x0;
        }
        else {
          if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)0x1fffffffffffffff < (ulong)IVar9) {
LAB_00106447:
            puVar13 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar13 = operator_delete;
            __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pvVar12 = malloc(IVar9 * 8);
          if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)IVar9 !=
              (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)0x1 && ((ulong)pvVar12 & 0xf) != 0) goto LAB_0010716a;
          if (pvVar12 == (void *)0x0) goto LAB_00106447;
        }
      }
      local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pvVar12;
      pPStack_a5d8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)IVar9;
    }
    if (pPStack_a5d8 ==
        (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
         *)IVar9) {
      pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                 *)((long)pPStack_a5d8 - ((long)pPStack_a5d8 >> 0x3f) & 0xfffffffffffffffe);
      if (1 < (long)pPStack_a5d8) {
        lVar22 = 0;
        do {
          pdVar3 = pdVar8 + lVar22;
          dVar6 = pdVar3[1];
          pdVar16 = (double *)
                    (local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows + lVar22 * 8);
          *pdVar16 = *pdVar3 * 0.1;
          pdVar16[1] = dVar6 * 0.1;
          lVar22 = lVar22 + 2;
        } while (lVar22 < (long)pPVar18);
      }
      if ((long)pPVar18 < (long)pPStack_a5d8) {
        do {
          *(double *)
           (local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows + (long)pPVar18 * 8) = pdVar8[(long)pPVar18] * 0.1;
          pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                &pPVar18->m_lhs)->m_storage).m_data + 1);
        } while (pPStack_a5d8 != pPVar18);
      }
      free(local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      stateObservation::ObserverBase::stateVectorRandom();
      pPVar18 = pPStack_a5c8;
      ppvVar14 = local_a5d0;
      local_a5d0 = (void **)local_a548.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
      pPStack_a5c8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)ppvVar14;
      local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)pPVar18;
      free(ppvVar14);
      stateObservation::ObserverBase::measureVectorRandom();
      pPVar18 = pPStack_a5a8;
      ppvVar14 = local_a5b0;
      local_a5b0 = (void **)local_a548.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
      pPStack_a5a8 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
      local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)ppvVar14;
      local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)pPVar18;
      free(ppvVar14);
      stateObservation::KalmanFilterBase::getAmatrixRandom();
      if (-1 < (long)((ulong)local_66b8.x[1] | (ulong)local_66b8.x[0])) {
        local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = (Index)local_66b8.x[0];
        local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = (Index)local_66b8.x[1];
        local_a530 = 0x3fe0000000000000;
        local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&local_66b8;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3eb8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_a548);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (&local_a5a0,local_3eb8,(assign_op<double,_double> *)&local_a678);
        free(local_3eb8[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free((void *)local_66b8._0_8_);
        stateObservation::KalmanFilterBase::getCmatrixRandom();
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (&MStack_a588,&local_a548,(assign_op<double,_double> *)local_3eb8);
        free(local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        stateObservation::ExtendedKalmanFilter::setFunctor
                  ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterZeroInput()::f);
        memset(&local_a548,0,0x3e90);
        memset(local_3eb8,0,16000);
        stateObservation::ObserverBase::inputVectorZero();
        stateObservation::ObserverBase::stateVectorZero();
        boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
                  (&local_66b8,
                   &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
        stateObservation::KalmanFilterBase::getRmatrixRandom();
        if (-1 < (local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols |
                 local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows)) {
          local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          local_a660 = 0x3f847ae147ae147b;
          local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)&local_a640;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a600,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                      *)&local_a678);
          free(local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data);
          stateObservation::KalmanFilterBase::getQmatrixRandom();
          if (-1 < (local_a628.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols |
                   local_a628.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows)) {
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = local_a628.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = local_a628.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols;
            local_a660 = 0x3f847ae147ae147b;
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)&local_a628;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a640,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        *)&local_a678);
            free(local_a628.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)&local_a600;
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = (Index)local_a678.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)&local_a628,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                        *)&local_a678);
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)&local_a640;
            local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = (Index)local_a678.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)&local_a560,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                        *)&local_a678);
            IVar9 = local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
            pdVar8 = local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            if (local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows !=
                local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              if (local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows < 0) {
LAB_001070df:
                __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                              "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                             );
              }
              free(local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)IVar9 ==
                  (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)0x0) {
                ppvVar14 = (void **)0x0;
              }
              else {
                if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)0x1fffffffffffffff < (ulong)IVar9) {
LAB_0010684d:
                  puVar13 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar13 = operator_delete;
                  __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                }
                ppvVar14 = (void **)malloc(IVar9 * 8);
                if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)IVar9 !=
                    (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)0x1 && ((ulong)ppvVar14 & 0xf) != 0) {
LAB_0010716a:
                  __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                                ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                                "void *Eigen::internal::aligned_malloc(std::size_t)");
                }
                if (ppvVar14 == (void **)0x0) goto LAB_0010684d;
              }
              local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows = IVar9;
              local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)ppvVar14;
            }
            if (local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows != IVar9) {
LAB_001070fe:
              pcVar17 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
              ;
              goto LAB_00107113;
            }
            pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                       *)(local_a548.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows - (local_a548.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe);
            if (1 < local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) {
              lVar22 = 0;
              do {
                pdVar3 = pdVar8 + lVar22;
                dVar6 = pdVar3[1];
                local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data[lVar22] = *pdVar3;
                (local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + lVar22)[1] = dVar6;
                lVar22 = lVar22 + 2;
              } while (lVar22 < (long)pPVar18);
            }
            if ((long)pPVar18 <
                local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows) {
              do {
                local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data[(long)pPVar18] = pdVar8[(long)pPVar18];
                pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                           *)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *
                                       )&pPVar18->m_lhs)->m_storage).m_data + 1);
              } while ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                        *)local_a548.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows != pPVar18);
            }
            lVar22 = 1;
            do {
              stateObservation::ObserverBase::stateVectorZero();
              uVar20 = 0;
              while( true ) {
                lVar15 = stateObservation::ObserverBase::getStateSize();
                uVar21 = (ulong)uVar20;
                if (lVar15 <= (long)uVar21) break;
                dVar6 = boost::random::detail::unit_normal_distribution<double>::operator()
                                  ((unit_normal_distribution<double> *)&local_a6a0,&local_66b8);
                if (local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows <= (long)uVar21) goto LAB_0010706b;
                (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data)->m_storage).m_data)[uVar21] = (double *)(dVar6 + 0.0);
                uVar20 = uVar20 + 1;
              }
              if (local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols !=
                  local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows) {
LAB_0010708a:
                __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                              ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                              "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                             );
              }
              local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)&local_a640;
              local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows = (Index)&local_a678;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                        ((Matrix<double,__1,_1,_0,__1,_1> *)&local_a678,
                         (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                          *)&local_a6a0,(assign_op<double,_double> *)&local_a6b8,(type)0x0);
              stateObservation::ObserverBase::measureVectorZero();
              uVar20 = 0;
              while( true ) {
                lVar15 = stateObservation::ObserverBase::getMeasureSize();
                uVar21 = (ulong)uVar20;
                if (lVar15 <= (long)uVar21) break;
                dVar6 = boost::random::detail::unit_normal_distribution<double>::operator()
                                  ((unit_normal_distribution<double> *)&local_a6b8,&local_66b8);
                if (local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows <= (long)uVar21) goto LAB_0010706b;
                (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data)->m_storage).m_data)[uVar21] = (double *)(dVar6 + 0.0);
                uVar20 = uVar20 + 1;
              }
              if (local_a600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols !=
                  local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows) goto LAB_0010708a;
              local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)&local_a600;
              k = 0;
              local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows = (Index)&local_a6a0;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                        ((Matrix<double,__1,_1,_0,__1,_1> *)&local_a6a0,
                         (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                          *)&local_a6b8,(assign_op<double,_double> *)&local_a688,(type)0x0);
              testExtendedKalmanFilterZeroInput()::KalmanFunctor::stateDynamics(Eigen::
              Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
                        ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                          *)&local_a6b8,&local_a5e8,&local_a6d0,k);
              IVar9 = local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
              pdVar3 = local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
              pdVar8 = local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
              if (local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows !=
                  local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows) {
LAB_001070a9:
                pcVar17 = 
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                ;
                goto LAB_001070be;
              }
              if (local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows !=
                  local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows) {
                if (local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows < 0) goto LAB_001070df;
                free(local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data);
                if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)IVar9 ==
                    (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                     *)0x0) {
                  pdVar16 = (double *)0x0;
                }
                else {
                  if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                       *)0x1fffffffffffffff < (ulong)IVar9) {
LAB_0010713c:
                    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
                    *puVar13 = operator_delete;
                    __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                  }
                  pdVar16 = (double *)malloc(IVar9 * 8);
                  if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                       *)IVar9 !=
                      (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                       *)0x1 && ((ulong)pdVar16 & 0xf) != 0) goto LAB_0010716a;
                  if (pdVar16 == (double *)0x0) goto LAB_0010713c;
                }
                local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = IVar9;
                local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar16;
              }
              if (local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows != IVar9) {
LAB_001070c8:
                pcVar17 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
                ;
                goto LAB_00107113;
              }
              pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                         *)(local_a6d0.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows - (local_a6d0.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe);
              if (1 < local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) {
                lVar15 = 0;
                do {
                  ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar8)
                             ->m_storage).m_data + lVar15;
                  ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar3)
                             ->m_storage).m_data + lVar15;
                  dVar6 = (double)ppdVar1[1] + (double)ppdVar2[1];
                  auVar4._8_4_ = SUB84(dVar6,0);
                  auVar4._0_8_ = (double)*ppdVar1 + (double)*ppdVar2;
                  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
                  *(undefined1 (*) [16])
                   (local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data + lVar15) = auVar4;
                  lVar15 = lVar15 + 2;
                } while (lVar15 < (long)pPVar18);
              }
              if ((long)pPVar18 <
                  local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows) {
                do {
                  local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[(long)pPVar18] =
                       (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  pdVar8)->m_storage).m_data)[(long)pPVar18] +
                       (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  pdVar3)->m_storage).m_data)[(long)pPVar18];
                  pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                             *)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          *)&pPVar18->m_lhs)->m_storage).m_data + 1);
                } while ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                          *)local_a6d0.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_rows != pPVar18);
              }
              free(local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              IVar9 = local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
              pdVar8 = local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              this = (DenseStorage<double,__1,__1,_1,_0> *)
                     (&local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data + lVar22 * 2);
              if ((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)(&local_a548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows)[lVar22 * 2] !=
                  (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows) {
                if (local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows < 0) goto LAB_001070df;
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                          (this,local_a6d0.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows,
                           local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           .m_storage.m_rows,1);
              }
              pPVar18 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                         *)(&local_a548.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows)[lVar22 * 2];
              if (pPVar18 !=
                  (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)IVar9) goto LAB_001070fe;
              pdVar3 = this->m_data;
              pPVar19 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                         *)((long)pPVar18 - ((long)pPVar18 >> 0x3f) & 0xfffffffffffffffe);
              if (1 < (long)pPVar18) {
                lVar15 = 0;
                do {
                  pdVar16 = pdVar8 + lVar15;
                  dVar6 = pdVar16[1];
                  pdVar3[lVar15] = *pdVar16;
                  (pdVar3 + lVar15)[1] = dVar6;
                  lVar15 = lVar15 + 2;
                } while (lVar15 < (long)pPVar19);
              }
              if ((long)pPVar19 < (long)pPVar18) {
                do {
                  pdVar3[(long)pPVar19] = pdVar8[(long)pPVar19];
                  pPVar19 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                             *)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          *)&pPVar19->m_lhs)->m_storage).m_data + 1);
                } while (pPVar18 != pPVar19);
              }
              testExtendedKalmanFilterZeroInput()::KalmanFunctor::measureDynamics(Eigen::
              Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
                        (&local_a6b8,&local_a5e8,&local_a6d0,(TimeIndex)pdVar3);
              IVar9 = local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
              pdVar3 = local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
              pdVar8 = local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
              if (local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows !=
                  local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows) goto LAB_001070a9;
              lVar15 = (lVar22 + -1) * 0x10;
              local_a6c0 = (double)lVar22;
              if (*(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    **)((long)local_3eb8 + lVar15 + 8) !=
                  (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows) {
                if (local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows < 0) goto LAB_001070df;
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                          ((DenseStorage<double,__1,__1,_1,_0> *)((long)local_3eb8 + lVar15),
                           local_a6a0.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows,
                           local_a6a0.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows,1);
              }
              pPVar18 = *(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                          **)((long)local_3eb8 + lVar15 + 8);
              if (pPVar18 !=
                  (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                   *)IVar9) goto LAB_001070c8;
              pdVar16 = ((DenseStorage<double,__1,__1,_1,_0> *)((long)local_3eb8 + lVar15))->m_data;
              pPVar19 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                         *)((long)pPVar18 - ((long)pPVar18 >> 0x3f) & 0xfffffffffffffffe);
              if (1 < (long)pPVar18) {
                lVar22 = 0;
                do {
                  ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar8)
                             ->m_storage).m_data + lVar22;
                  ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar3)
                             ->m_storage).m_data + lVar22;
                  dVar6 = (double)ppdVar2[1] + (double)ppdVar1[1];
                  auVar5._8_4_ = SUB84(dVar6,0);
                  auVar5._0_8_ = (double)*ppdVar2 + (double)*ppdVar1;
                  auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
                  *(undefined1 (*) [16])(pdVar16 + lVar22) = auVar5;
                  lVar22 = lVar22 + 2;
                } while (lVar22 < (long)pPVar19);
              }
              if ((long)pPVar19 < (long)pPVar18) {
                do {
                  pdVar16[(long)pPVar19] =
                       (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  pdVar8)->m_storage).m_data)[(long)pPVar19] +
                       (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  pdVar3)->m_storage).m_data)[(long)pPVar19];
                  pPVar19 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                             *)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          *)&pPVar19->m_lhs)->m_storage).m_data + 1);
                } while (pPVar18 != pPVar19);
              }
              free(local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free(local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              lVar22 = (long)local_a6c0 + 1;
            } while (lVar22 != 0x3e9);
            stateObservation::ObserverBase::stateVectorRandom();
            stateObservation::ZeroDelayObserver::setState
                      ((Matrix *)testExtendedKalmanFilterZeroInput()::f,(long)&local_a548);
            stateObservation::KalmanFilterBase::getPmatrixZero();
            stateObservation::KalmanFilterBase::setStateCovariance
                      ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
            stateObservation::KalmanFilterBase::setR
                      ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
            stateObservation::KalmanFilterBase::setQ
                      ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
            for (uVar21 = 0; lVar22 = stateObservation::ObserverBase::getStateSize(),
                (long)uVar21 < lVar22; uVar21 = (ulong)((int)uVar21 + 1)) {
              if ((long)local_a688.m_rhs <= (long)uVar21) {
LAB_0010706b:
                __assert_fail("index >= 0 && index < size()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                             );
              }
              if ((local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows <= (long)uVar21) ||
                 (local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols <= (long)uVar21)) {
                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                             );
              }
              (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data)->m_storage).m_data)
              [local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows * uVar21 + uVar21] =
                   (&((local_a688.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data)[uVar21];
            }
            local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)&local_a6a0;
            local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = (Index)&local_a6a0;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)&local_a678,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                        *)&local_a6b8);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                      (&local_a6a0,&local_a678,(assign_op<double,_double> *)local_a610);
            free(local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            stateObservation::ObserverBase::stateVectorConstant(1.0);
            if (-1 < local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows) {
              local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows = local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows;
              local_a660 = 0x3e45798ee2308c3a;
              local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)&local_a6b8;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_a610,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                          *)&local_a678);
              free(local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              lVar22 = 1;
              pIVar23 = (Index *)local_3eb8;
              do {
                stateObservation::ZeroDelayObserver::setMeasurement
                          ((Matrix *)testExtendedKalmanFilterZeroInput()::f,(long)pIVar23);
                stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_a678);
                stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_a6b8);
                stateObservation::KalmanFilterBase::setA
                          ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
                stateObservation::KalmanFilterBase::setC
                          ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
                stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_a650);
                pMVar10 = local_a688.m_rhs;
                __ptr = local_a688.m_lhs;
                local_a688.m_lhs = (LhsNested)local_a650;
                local_a688.m_rhs = pMStack_a648;
                local_a650 = (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                              *)__ptr;
                pMStack_a648 = pMVar10;
                free(__ptr);
                free(local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                lVar22 = lVar22 + 1;
                pIVar23 = pIVar23 + 2;
              } while (lVar22 != 0x3e9);
              local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows = (Index)&local_66c8;
              local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data = (double *)&local_a688;
              if (local_a688.m_rhs == local_66c8.m_rhs) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                          ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a650,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&local_a678);
                local_a6b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data = (double *)&local_a650;
                if (pMStack_a648 == (RhsNested)0x0) {
                  uVar24 = 0;
                  uVar25 = 0;
                }
                else {
                  if ((long)pMStack_a648 < 1) {
                    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                                 );
                  }
                  local_a678.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows = (Index)local_a650;
                  SVar7 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                          ::
                          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      *)&local_a678,&local_a6d1,
                                     (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      *)&local_a6b8);
                  uVar24 = SUB84(SVar7,0);
                  uVar25 = (undefined4)((ulong)SVar7 >> 0x20);
                }
                local_a6c0 = (double)CONCAT44(uVar25,uVar24);
                free(local_a650);
                free(local_a610[0]);
                free(local_a6a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a688.m_lhs);
                free(local_a560);
                free(local_a628.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a640.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a600.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a6d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data);
                free(local_a570);
                lVar22 = 16000;
                do {
                  free(*(void **)((long)local_3eb8 + lVar22 + -0x10));
                  lVar22 = lVar22 + -0x10;
                } while (lVar22 != 0);
                lVar22 = 0x3e90;
                do {
                  free(*(void **)((long)auStack_a558 + lVar22));
                  lVar22 = lVar22 + -0x10;
                } while (lVar22 != 0);
                local_a6c0 = SQRT(local_a6c0);
                local_a5e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)&PTR__KalmanFunctor_0011ecd8;
                free(MStack_a588.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a5a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_a5b0);
                free(local_a5c0);
                free(local_a5d0);
                free((void *)local_a5e8.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows);
                stateObservation::DynamicalSystemFunctorBase::~DynamicalSystemFunctorBase
                          ((DynamicalSystemFunctorBase *)&local_a5e8);
                return local_a6c0;
              }
              pcVar17 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
LAB_001070be:
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar17);
            }
            goto LAB_001071a0;
          }
        }
      }
      pcVar17 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_001071b5;
    }
  }
  pcVar17 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
  ;
LAB_00107113:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar17);
}

Assistant:

double testExtendedKalmanFilterZeroInput()
{
  const static stateObservation::Index kmax = 1000;

  typedef stateObservation::ExtendedKalmanFilter ekf;

  static ekf f(4, 3);

  class KalmanFunctor : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    KalmanFunctor()
    {
      m_ = f.measureVectorRandom() * 0.1;
      s_ = f.stateVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
    }

    virtual ekf::StateVector stateDynamics(const ekf::StateVector & x,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::StateVector xk1;
      xk1 = a_ * x + cos(10 * (x.transpose() * x)[0]) * s_ + t_;
      return xk1;
    }

    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & x,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * x + cos(10 * (x.transpose() * x)[0]) * m_ + n_;
      return yk;
    }

    void setA(const ekf::Amatrix & a)
    {
      a_ = a;
    }

    void setC(const ekf::Cmatrix & c)
    {
      c_ = c;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

  private:
    ekf::StateVector s_;
    ekf::StateVector t_;
    ekf::MeasureVector m_;
    ekf::MeasureVector n_;

    ekf::Amatrix a_;
    ekf::Cmatrix c_;
  };

  KalmanFunctor func;

  func.setA(f.getAmatrixRandom() * 0.5);
  func.setC(f.getCmatrixRandom());

  f.setFunctor(&func);

  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector u = f.inputVectorZero();

  ekf::StateVector x = f.stateVectorZero();

  boost::lagged_fibonacci1279 gen_;

  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  xk[0] = x;

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {
    ekf::StateVector v(f.stateVectorZero());
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    ekf::MeasureVector w(f.measureVectorZero());
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    x = func.stateDynamics(x, u, k - 1) + v;

    xk[k] = x;
    yk[k - 1] = func.measureDynamics(x, u, k) + w;
  }

  ekf::StateVector xh = f.stateVectorRandom();

  f.setState(xk[0], 0);

  ekf::Pmatrix p = f.getPmatrixZero();

  f.setStateCovariance(p);

  f.setR(r);
  f.setQ(q);

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);

    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    f.setA(a);
    f.setC(c);
    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}